

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteKvIoNewPage(unqlite_kv_handle pHandle,unqlite_page **ppPage)

{
  int iVar1;
  int in_R8D;
  
  iVar1 = pager_shared_lock((Pager *)pHandle);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = unqlitePagerAcquire((Pager *)pHandle,
                              *(long *)((long)pHandle + 0x40) +
                              (ulong)(*(long *)((long)pHandle + 0x40) == 0),ppPage,0,in_R8D);
  return iVar1;
}

Assistant:

static int unqliteKvIoNewPage(unqlite_kv_handle pHandle,unqlite_page **ppPage)
{
	Pager *pPager = (Pager *)pHandle;
	int rc;
	/* 
	 * Acquire a reader-lock first so that pPager->dbSize get initialized.
	 */
	rc = pager_shared_lock(pPager);
	if( rc == UNQLITE_OK ){
		rc = unqlitePagerAcquire(pPager,pPager->dbSize == 0 ? /* Page 0 is reserved */ 1 : pPager->dbSize ,ppPage,0,0);
	}
	return rc;
}